

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *ppbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  Encoding encoding;
  uint uVar6;
  cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar7;
  cmArgumentParser<Arguments> *pcVar8;
  reference pvVar9;
  ulong uVar10;
  undefined8 uVar11;
  cmsysProcess *__p;
  pointer cp_00;
  size_type sVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  iterator iVar15;
  reference ppcVar16;
  char **command_00;
  char *pcVar17;
  string *psVar18;
  reference r;
  static_string_view sVar19;
  string local_740;
  char *local_720;
  char local_718 [8];
  char buf_1 [16];
  int iStack_6f8;
  int exitCode;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  char buf [16];
  undefined1 local_6c0 [4];
  int v;
  vector<char,_std::allocator<char>_> local_6a8;
  string local_690;
  string local_670;
  undefined1 local_650 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_628;
  int p;
  char *data;
  undefined1 local_618 [4];
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  string command;
  string error;
  string local_560;
  undefined1 local_540 [8];
  string echo_output;
  bool echo_output_from_variable;
  bool echo_stderr;
  bool echo_stdout;
  bool merge_output;
  allocator<const_char_*> local_4e9;
  undefined1 local_4e8 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1_1;
  cmsysProcess *cp;
  undefined1 local_4a0 [8];
  unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)> cp_ptr;
  string local_488;
  double local_468;
  double timeout;
  string local_458;
  reference local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined4 local_36c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  cmArgumentParser<Arguments> local_78;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_4_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExecuteProcessCommand *this_local;
  
  local_28 = param_2;
  param_4_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_003d00b3;
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar5 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar5 != 0)) {
    local_78.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_78);
    sVar19 = ::cm::operator____s("COMMAND",7);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::
                Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                            *)&local_78,sVar19,0);
    sVar19 = ::cm::operator____s("COMMAND_ECHO",0xc);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x138);
    sVar19 = ::cm::operator____s("OUTPUT_VARIABLE",0xf);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x18);
    sVar19 = ::cm::operator____s("ERROR_VARIABLE",0xe);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x38);
    sVar19 = ::cm::operator____s("RESULT_VARIABLE",0xf);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x58);
    sVar19 = ::cm::operator____s("RESULTS_VARIABLE",0x10);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x78);
    sVar19 = ::cm::operator____s("WORKING_DIRECTORY",0x11);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x98);
    sVar19 = ::cm::operator____s("INPUT_FILE",10);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0xb8);
    sVar19 = ::cm::operator____s("OUTPUT_FILE",0xb);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0xd8);
    sVar19 = ::cm::operator____s("ERROR_FILE",10);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar7,sVar19,0xf8);
    sVar19 = ::cm::operator____s("TIMEOUT",7);
    pcVar8 = cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x118);
    sVar19 = ::cm::operator____s("OUTPUT_QUIET",0xc);
    pcVar8 = cmArgumentParser<Arguments>::Bind<bool>(pcVar8,sVar19,0x158);
    sVar19 = ::cm::operator____s("ERROR_QUIET",0xb);
    pcVar8 = cmArgumentParser<Arguments>::Bind<bool>(pcVar8,sVar19,0x159);
    sVar19 = ::cm::operator____s("OUTPUT_STRIP_TRAILING_WHITESPACE",0x20);
    pcVar8 = cmArgumentParser<Arguments>::Bind<bool>(pcVar8,sVar19,0x15a);
    sVar19 = ::cm::operator____s("ERROR_STRIP_TRAILING_WHITESPACE",0x1f);
    pcVar7 = (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar8,sVar19,0x15b);
    sVar19 = ::cm::operator____s("ENCODING",8);
    pcVar8 = cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::__cxx11::string>(pcVar7,sVar19,0x160);
    cmArgumentParser<Arguments>::cmArgumentParser(&InitialPass::parser,pcVar8);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_78);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&InitialPass::parser,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  ppbVar1 = &keywordsMissingValue.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppbVar1);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&arguments.Encoding.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Arguments *)local_328,
             (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&InitialPass::parser,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)param_4_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1,this_00);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&arguments.Encoding.field_2 + 8));
  if (bVar3) {
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&keywordsMissingValue.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) {
      bVar3 = cmMakefile::CanIWriteThisFile
                        ((this->super_cmCommand).Makefile,
                         (string *)((long)&arguments.InputFile.field_2 + 8));
      if (bVar3) {
        bVar3 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::empty((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_328);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410," called with no COMMAND argument.",
                     (allocator<char> *)((long)&__range1 + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_410);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
          this_local._7_1_ = 0;
          local_36c = 1;
        }
        else {
          __end1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_328);
          cmd = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_328);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                             *)&cmd), bVar3) {
            local_438 = __gnu_cxx::
                        __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator*(&__end1);
            bVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(local_438);
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_458," given COMMAND argument with no value.",
                         (allocator<char> *)((long)&timeout + 7));
              cmCommand::SetError(&this->super_cmCommand,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              std::allocator<char>::~allocator((allocator<char> *)((long)&timeout + 7));
              this_local._7_1_ = 0;
              local_36c = 1;
              goto LAB_003d0067;
            }
            __gnu_cxx::
            __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator++(&__end1);
          }
          local_468 = -1.0;
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            uVar11 = std::__cxx11::string::c_str();
            iVar5 = __isoc99_sscanf(uVar11,"%lg",&local_468);
            if (iVar5 != 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_488," called with TIMEOUT value that could not be parsed."
                         ,(allocator<char> *)
                          ((long)&cp_ptr._M_t.
                                  super___uniq_ptr_impl<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_cmsysProcess_s_*,_void_(*)(cmsysProcess_s_*)>
                                  .super__Head_base<0UL,_cmsysProcess_s_*,_false>._M_head_impl + 7))
              ;
              cmCommand::SetError(&this->super_cmCommand,&local_488);
              std::__cxx11::string::~string((string *)&local_488);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&cp_ptr._M_t.
                                 super___uniq_ptr_impl<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_cmsysProcess_s_*,_void_(*)(cmsysProcess_s_*)>
                                 .super__Head_base<0UL,_cmsysProcess_s_*,_false>._M_head_impl + 7));
              this_local._7_1_ = 0;
              local_36c = 1;
              goto LAB_003d0067;
            }
          }
          __p = cmsysProcess_New();
          cp = (cmsysProcess *)cmsysProcess_Delete;
          std::unique_ptr<cmsysProcess_s,void(*)(cmsysProcess_s*)>::
          unique_ptr<void(*)(cmsysProcess_s*),void>
                    ((unique_ptr<cmsysProcess_s,void(*)(cmsysProcess_s*)> *)local_4a0,__p,
                     (__enable_if_t<_is_lvalue_reference<void_(*)(cmsysProcess_s_*)>::value,_void_(*&&)(cmsysProcess_s_*)>
                      )&cp);
          cp_00 = std::unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>::get
                            ((unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)> *)local_4a0);
          __end1_1 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_328);
          cmd_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_328);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1_1,
                                    (__normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                     *)&cmd_1), bVar3) {
            argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator*(&__end1_1);
            sVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::allocator<const_char_*>::allocator(&local_4e9);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_4e8,sVar12 + 1,
                       &local_4e9);
            std::allocator<const_char_*>::~allocator(&local_4e9);
            cVar13 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cVar14 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
            iVar15 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                               ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_4e8);
            std::
            transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                      (cVar13._M_current,cVar14._M_current,iVar15._M_current);
            ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::back
                                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_4e8);
            *ppcVar16 = (value_type)0x0;
            command_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                   ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_4e8
                                   );
            cmsysProcess_AddCommand(cp_00,command_00);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_4e8);
            __gnu_cxx::
            __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator++(&__end1_1);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar17 = (char *)std::__cxx11::string::c_str();
            cmsysProcess_SetWorkingDirectory(cp_00,pcVar17);
          }
          cmsysProcess_SetOption(cp_00,0,1);
          echo_output.field_2._M_local_buf[0xf] = '\0';
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar17 = (char *)std::__cxx11::string::c_str();
            cmsysProcess_SetPipeFile(cp_00,1,pcVar17);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar17 = (char *)std::__cxx11::string::c_str();
            cmsysProcess_SetPipeFile(cp_00,2,pcVar17);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&arguments.OutputFile.field_2 + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&arguments.InputFile.field_2 + 8));
            if (_Var4) {
              echo_output.field_2._M_local_buf[0xf] = '\x01';
            }
            else {
              pcVar17 = (char *)std::__cxx11::string::c_str();
              cmsysProcess_SetPipeFile(cp_00,3,pcVar17);
            }
          }
          uVar10 = std::__cxx11::string::empty();
          if (((uVar10 & 1) == 0) &&
             (_Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&arguments.Commands.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&arguments.OutputVariable.field_2 + 8)), _Var4)) {
            echo_output.field_2._M_local_buf[0xf] = '\x01';
          }
          if ((echo_output.field_2._M_local_buf[0xf] & 1U) != 0) {
            cmsysProcess_SetOption(cp_00,2,1);
          }
          if (0.0 <= local_468) {
            cmsysProcess_SetTimeout(cp_00,local_468);
          }
          echo_output.field_2._M_local_buf[0xe] = '\0';
          echo_output.field_2._M_local_buf[0xd] = '\0';
          echo_output.field_2._M_local_buf[0xc] = '\x01';
          pcVar2 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_560,"CMAKE_EXECUTE_PROCESS_COMMAND_ECHO",
                     (allocator<char> *)(error.field_2._M_local_buf + 0xf));
          psVar18 = cmMakefile::GetSafeDefinition(pcVar2,&local_560);
          std::__cxx11::string::string((string *)local_540,(string *)psVar18);
          std::__cxx11::string::~string((string *)&local_560);
          std::allocator<char>::~allocator((allocator<char> *)(error.field_2._M_local_buf + 0xf));
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            echo_output.field_2._M_local_buf[0xc] = '\0';
            std::__cxx11::string::operator=
                      ((string *)local_540,(string *)(arguments.Timeout.field_2._M_local_buf + 8));
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_540,"STDERR");
            if (bVar3) {
              echo_output.field_2._M_local_buf[0xd] = '\x01';
              goto LAB_003cf462;
            }
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_540,"STDOUT");
            if (bVar3) {
              echo_output.field_2._M_local_buf[0xe] = '\x01';
              goto LAB_003cf462;
            }
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_540,"NONE");
            if (!bVar3) goto LAB_003cf462;
            std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8));
            if ((echo_output.field_2._M_local_buf[0xc] & 1U) == 0) {
              std::__cxx11::string::operator=
                        ((string *)(command.field_2._M_local_buf + 8)," called with \'");
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)(command.field_2._M_local_buf + 8),
                         "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to \'");
            }
            std::__cxx11::string::operator+=
                      ((string *)(command.field_2._M_local_buf + 8),(string *)local_540);
            std::__cxx11::string::operator+=
                      ((string *)(command.field_2._M_local_buf + 8),"\' expected STDERR|STDOUT|NONE"
                      );
            if ((echo_output.field_2._M_local_buf[0xc] & 1U) == 0) {
              std::__cxx11::string::operator+=
                        ((string *)(command.field_2._M_local_buf + 8)," for COMMAND_ECHO.");
            }
            cmMakefile::IssueMessage
                      ((this->super_cmCommand).Makefile,FATAL_ERROR,
                       (string *)((long)&command.field_2 + 8));
            this_local._7_1_ = 1;
            local_36c = 1;
            std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
          }
          else {
LAB_003cf462:
            if (((echo_output.field_2._M_local_buf[0xe] & 1U) != 0) ||
               ((echo_output.field_2._M_local_buf[0xd] & 1U) != 0)) {
              std::__cxx11::string::string((string *)&__range2);
              __end2 = std::
                       vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_328);
              cmd_2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)std::
                         vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_328);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end2,(__normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                 *)&cmd_2), bVar3) {
                r = __gnu_cxx::
                    __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator*(&__end2);
                std::__cxx11::string::operator+=((string *)&__range2,"\'");
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)
                           &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10,r,"\' \'");
                std::__cxx11::string::operator+=
                          ((string *)&__range2,
                           (string *)
                           &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
                std::__cxx11::string::~string
                          ((string *)
                           &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
                std::__cxx11::string::operator+=((string *)&__range2,"\'");
                std::__cxx11::string::operator+=((string *)&__range2,"\n");
                __gnu_cxx::
                __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator++(&__end2);
              }
              if ((echo_output.field_2._M_local_buf[0xe] & 1U) == 0) {
                if ((echo_output.field_2._M_local_buf[0xd] & 1U) != 0) {
                  std::operator<<((ostream *)&std::cerr,(string *)&__range2);
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,(string *)&__range2);
              }
              std::__cxx11::string::~string((string *)&__range2);
            }
            cmsysProcess_Execute(cp_00);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_618);
            encoding = cmProcessOutput::FindEncoding((string *)&arguments.OutputQuiet);
            cmProcessOutput::cmProcessOutput
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
            std::__cxx11::string::string((string *)local_650);
            while (strdata.field_2._12_4_ =
                        cmsysProcess_WaitForData
                                  (cp_00,&stack0xfffffffffffff9d8,(int *)((long)&data + 4),
                                   (double *)0x0), strdata.field_2._12_4_ != 0) {
              if ((strdata.field_2._12_4_ == 2) &&
                 ((arguments.CommandEcho.field_2._M_local_buf[8] & 1U) == 0)) {
                uVar10 = std::__cxx11::string::empty();
                if ((uVar10 & 1) == 0) {
                  cmExecuteProcessCommandAppend
                            ((vector<char,_std::allocator<char>_> *)
                             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10,pcStack_628,data._4_4_);
                }
                else {
                  cmProcessOutput::DecodeText
                            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_628,
                             (long)data._4_4_,(string *)local_650,1);
                  cmSystemTools::Stdout((string *)local_650);
                }
              }
              else if ((strdata.field_2._12_4_ == 3) &&
                      ((arguments.CommandEcho.field_2._M_local_buf[9] & 1U) == 0)) {
                uVar10 = std::__cxx11::string::empty();
                if ((uVar10 & 1) == 0) {
                  cmExecuteProcessCommandAppend
                            ((vector<char,_std::allocator<char>_> *)local_618,pcStack_628,data._4_4_
                            );
                }
                else {
                  cmProcessOutput::DecodeText
                            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_628,
                             (long)data._4_4_,(string *)local_650,2);
                  cmSystemTools::Stderr((string *)local_650);
                }
              }
            }
            if (((arguments.CommandEcho.field_2._M_local_buf[8] & 1U) == 0) &&
               (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
              std::__cxx11::string::string((string *)&local_670);
              cmProcessOutput::DecodeText
                        ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_670,
                         (string *)local_650,1);
              std::__cxx11::string::~string((string *)&local_670);
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                cmSystemTools::Stdout((string *)local_650);
              }
            }
            if (((arguments.CommandEcho.field_2._M_local_buf[9] & 1U) == 0) &&
               (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
              std::__cxx11::string::string((string *)&local_690);
              cmProcessOutput::DecodeText
                        ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_690,
                         (string *)local_650,2);
              std::__cxx11::string::~string((string *)&local_690);
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                cmSystemTools::Stderr((string *)local_650);
              }
            }
            cmsysProcess_WaitForExit(cp_00,(double *)0x0);
            std::vector<char,_std::allocator<char>_>::vector
                      (&local_6a8,
                       (vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_6a8,
                       (vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,0);
            std::vector<char,_std::allocator<char>_>::~vector(&local_6a8);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_6c0,
                       (vector<char,_std::allocator<char>_> *)local_618);
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),
                       (vector<char,_std::allocator<char>_> *)local_6c0,
                       (vector<char,_std::allocator<char>_> *)local_618,0);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_6c0);
            cmExecuteProcessCommandFixText
                      ((vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,(bool)(arguments.CommandEcho.field_2._M_local_buf[10] & 1));
            cmExecuteProcessCommandFixText
                      ((vector<char,_std::allocator<char>_> *)local_618,
                       (bool)(arguments.CommandEcho.field_2._M_local_buf[0xb] & 1));
            uVar10 = std::__cxx11::string::empty();
            if (((uVar10 & 1) == 0) &&
               (bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                  ((vector<char,_std::allocator<char>_> *)
                                   &tempError.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10), !bVar3)) {
              pcVar2 = (this->super_cmCommand).Makefile;
              pcVar17 = std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)
                                   &tempError.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10);
              cmMakefile::AddDefinition
                        (pcVar2,(string *)
                                &arguments.Commands.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar17);
            }
            if ((((echo_output.field_2._M_local_buf[0xf] & 1U) == 0) &&
                (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) &&
               (bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                  ((vector<char,_std::allocator<char>_> *)local_618), !bVar3)) {
              pcVar2 = (this->super_cmCommand).Makefile;
              pcVar17 = std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)local_618);
              cmMakefile::AddDefinition
                        (pcVar2,(string *)((long)&arguments.OutputVariable.field_2 + 8),pcVar17);
            }
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              iVar5 = cmsysProcess_GetState(cp_00);
              switch(iVar5) {
              case 1:
                pcVar2 = (this->super_cmCommand).Makefile;
                pcVar17 = cmsysProcess_GetErrorString(cp_00);
                cmMakefile::AddDefinition
                          (pcVar2,(string *)((long)&arguments.ErrorVariable.field_2 + 8),pcVar17);
                break;
              case 2:
                pcVar2 = (this->super_cmCommand).Makefile;
                pcVar17 = cmsysProcess_GetExceptionString(cp_00);
                cmMakefile::AddDefinition
                          (pcVar2,(string *)((long)&arguments.ErrorVariable.field_2 + 8),pcVar17);
                break;
              case 4:
                uVar6 = cmsysProcess_GetExitValue(cp_00);
                ppbVar1 = &res.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                sprintf((char *)ppbVar1,"%d",(ulong)uVar6);
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,
                           (string *)((long)&arguments.ErrorVariable.field_2 + 8),(char *)ppbVar1);
                break;
              case 5:
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,
                           (string *)((long)&arguments.ErrorVariable.field_2 + 8),
                           "Process terminated due to timeout");
              }
            }
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              iVar5 = cmsysProcess_GetState(cp_00);
              switch(iVar5) {
              case 1:
                pcVar2 = (this->super_cmCommand).Makefile;
                pcVar17 = cmsysProcess_GetErrorString(cp_00);
                cmMakefile::AddDefinition
                          (pcVar2,(string *)((long)&arguments.ResultVariable.field_2 + 8),pcVar17);
                break;
              case 2:
                pcVar2 = (this->super_cmCommand).Makefile;
                pcVar17 = cmsysProcess_GetExceptionString(cp_00);
                cmMakefile::AddDefinition
                          (pcVar2,(string *)((long)&arguments.ResultVariable.field_2 + 8),pcVar17);
                break;
              case 4:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i);
                for (_iStack_6f8 = 0;
                    sVar12 = std::
                             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ::size((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_328), _iStack_6f8 < sVar12;
                    _iStack_6f8 = _iStack_6f8 + 1) {
                  iVar5 = cmsysProcess_GetStateByIndex(cp_00,iStack_6f8);
                  if (iVar5 == 1) {
LAB_003cfe21:
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[36]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &i,(char (*) [36])"Error getting the child return code");
                  }
                  else if (iVar5 == 2) {
                    local_720 = cmsysProcess_GetExceptionStringByIndex(cp_00,iStack_6f8);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &i,&local_720);
                  }
                  else {
                    if (iVar5 != 4) goto LAB_003cfe21;
                    uVar6 = cmsysProcess_GetExitValueByIndex(cp_00,iStack_6f8);
                    sprintf(local_718,"%d",(ulong)uVar6);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char(&)[16]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &i,(char (*) [16])local_718);
                  }
                }
                pcVar2 = (this->super_cmCommand).Makefile;
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&local_740,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,";");
                pcVar17 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition
                          (pcVar2,(string *)((long)&arguments.ResultVariable.field_2 + 8),pcVar17);
                std::__cxx11::string::~string((string *)&local_740);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i);
                break;
              case 5:
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,
                           (string *)((long)&arguments.ResultVariable.field_2 + 8),
                           "Process terminated due to timeout");
              }
            }
            this_local._7_1_ = 1;
            local_36c = 1;
            std::__cxx11::string::~string((string *)local_650);
            cmProcessOutput::~cmProcessOutput
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_618);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
          }
          std::__cxx11::string::~string((string *)local_540);
          std::unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>::~unique_ptr
                    ((unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)> *)local_4a0);
        }
      }
      else {
        std::operator+(&local_3f0,"attempted to output into a file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arguments.InputFile.field_2 + 8));
        std::operator+(&local_3d0,&local_3f0," into a source directory.");
        cmCommand::SetError(&this->super_cmCommand,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
        local_36c = 1;
      }
    }
    else {
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&keywordsMissingValue.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_3b0," given unknown argument \"",pvVar9);
      std::operator+(&local_390,&local_3b0,"\".");
      cmCommand::SetError(&this->super_cmCommand,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      this_local._7_1_ = 0;
      local_36c = 1;
    }
  }
  else {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&arguments.Encoding.field_2 + 8));
    std::operator+(&local_368," called with no value for ",pvVar9);
    std::operator+(&local_348,&local_368,".");
    cmCommand::SetError(&this->super_cmCommand,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    this_local._7_1_ = 0;
    local_36c = 1;
  }
LAB_003d0067:
  InitialPass::Arguments::~Arguments((Arguments *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&arguments.Encoding.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&keywordsMissingValue.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_003d00b3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  struct Arguments
  {
    std::vector<std::vector<std::string>> Commands;
    std::string OutputVariable;
    std::string ErrorVariable;
    std::string ResultVariable;
    std::string ResultsVariable;
    std::string WorkingDirectory;
    std::string InputFile;
    std::string OutputFile;
    std::string ErrorFile;
    std::string Timeout;
    std::string CommandEcho;
    bool OutputQuiet = false;
    bool ErrorQuiet = false;
    bool OutputStripTrailingWhitespace = false;
    bool ErrorStripTrailingWhitespace = false;
    std::string Encoding;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("COMMAND"_s, &Arguments::Commands)
      .Bind("COMMAND_ECHO"_s, &Arguments::CommandEcho)
      .Bind("OUTPUT_VARIABLE"_s, &Arguments::OutputVariable)
      .Bind("ERROR_VARIABLE"_s, &Arguments::ErrorVariable)
      .Bind("RESULT_VARIABLE"_s, &Arguments::ResultVariable)
      .Bind("RESULTS_VARIABLE"_s, &Arguments::ResultsVariable)
      .Bind("WORKING_DIRECTORY"_s, &Arguments::WorkingDirectory)
      .Bind("INPUT_FILE"_s, &Arguments::InputFile)
      .Bind("OUTPUT_FILE"_s, &Arguments::OutputFile)
      .Bind("ERROR_FILE"_s, &Arguments::ErrorFile)
      .Bind("TIMEOUT"_s, &Arguments::Timeout)
      .Bind("OUTPUT_QUIET"_s, &Arguments::OutputQuiet)
      .Bind("ERROR_QUIET"_s, &Arguments::ErrorQuiet)
      .Bind("OUTPUT_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::OutputStripTrailingWhitespace)
      .Bind("ERROR_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::ErrorStripTrailingWhitespace)
      .Bind("ENCODING"_s, &Arguments::Encoding);

  std::vector<std::string> unparsedArguments;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unparsedArguments, &keywordsMissingValue);

  if (!keywordsMissingValue.empty()) {
    this->SetError(" called with no value for " +
                   keywordsMissingValue.front() + ".");
    return false;
  }
  if (!unparsedArguments.empty()) {
    this->SetError(" given unknown argument \"" + unparsedArguments.front() +
                   "\".");
    return false;
  }

  if (!this->Makefile->CanIWriteThisFile(arguments.OutputFile)) {
    this->SetError("attempted to output into a file: " + arguments.OutputFile +
                   " into a source directory.");
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (arguments.Commands.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!arguments.Timeout.empty()) {
    if (sscanf(arguments.Timeout.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }
  // Create a process instance.
  std::unique_ptr<cmsysProcess, void (*)(cmsysProcess*)> cp_ptr(
    cmsysProcess_New(), cmsysProcess_Delete);
  cmsysProcess* cp = cp_ptr.get();

  // Set the command sequence.
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    std::vector<const char*> argv(cmd.size() + 1);
    std::transform(cmd.begin(), cmd.end(), argv.begin(),
                   [](std::string const& s) { return s.c_str(); });
    argv.back() = nullptr;
    cmsysProcess_AddCommand(cp, argv.data());
  }

  // Set the process working directory.
  if (!arguments.WorkingDirectory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, arguments.WorkingDirectory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!arguments.InputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN,
                             arguments.InputFile.c_str());
  }
  if (!arguments.OutputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             arguments.OutputFile.c_str());
  }
  if (!arguments.ErrorFile.empty()) {
    if (arguments.ErrorFile == arguments.OutputFile) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               arguments.ErrorFile.c_str());
    }
  }
  if (!arguments.OutputVariable.empty() &&
      arguments.OutputVariable == arguments.ErrorVariable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  bool echo_stdout = false;
  bool echo_stderr = false;
  bool echo_output_from_variable = true;
  std::string echo_output =
    this->Makefile->GetSafeDefinition("CMAKE_EXECUTE_PROCESS_COMMAND_ECHO");
  if (!arguments.CommandEcho.empty()) {
    echo_output_from_variable = false;
    echo_output = arguments.CommandEcho;
  }

  if (!echo_output.empty()) {
    if (echo_output == "STDERR") {
      echo_stderr = true;
    } else if (echo_output == "STDOUT") {
      echo_stdout = true;
    } else if (echo_output != "NONE") {
      std::string error;
      if (echo_output_from_variable) {
        error = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to '";
      } else {
        error = " called with '";
      }
      error += echo_output;
      error += "' expected STDERR|STDOUT|NONE";
      if (!echo_output_from_variable) {
        error += " for COMMAND_ECHO.";
      }
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, error);
      return true;
    }
  }
  if (echo_stdout || echo_stderr) {
    std::string command;
    for (auto& cmd : arguments.Commands) {
      command += "'";
      command += cmJoin(cmd, "' '");
      command += "'";
      command += "\n";
    }
    if (echo_stdout) {
      std::cout << command;
    } else if (echo_stderr) {
      std::cerr << command;
    }
  }
  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(
    cmProcessOutput::FindEncoding(arguments.Encoding));
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !arguments.OutputQuiet) {
      if (arguments.OutputVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !arguments.ErrorQuiet) {
      if (arguments.ErrorVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!arguments.OutputQuiet && arguments.OutputVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!arguments.ErrorQuiet && arguments.ErrorVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 arguments.OutputStripTrailingWhitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 arguments.ErrorStripTrailingWhitespace);

  // Store the output obtained.
  if (!arguments.OutputVariable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(arguments.OutputVariable, tempOutput.data());
  }
  if (!merge_output && !arguments.ErrorVariable.empty() &&
      !tempError.empty()) {
    this->Makefile->AddDefinition(arguments.ErrorVariable, tempError.data());
  }

  // Store the result of running the process.
  if (!arguments.ResultVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(arguments.ResultVariable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!arguments.ResultsVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < arguments.Commands.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  return true;
}